

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedTimeSamples<bool>::add_blocked_sample(TypedTimeSamples<bool> *this,double t)

{
  undefined1 local_28 [8];
  Sample s;
  double t_local;
  TypedTimeSamples<bool> *this_local;
  
  s._8_8_ = t;
  Sample::Sample((Sample *)local_28);
  local_28[0] = s.value;
  local_28[1] = s.blocked;
  local_28._2_6_ = s._10_6_;
  s.t._1_1_ = 1;
  ::std::
  vector<tinyusdz::TypedTimeSamples<bool>::Sample,std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<bool>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<bool>::Sample,std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>>
              *)this,(Sample *)local_28);
  this->_dirty = true;
  return;
}

Assistant:

void add_blocked_sample(const double t) {
    Sample s;
    s.t = t;
    s.blocked = true;
    _samples.emplace_back(s);
    _dirty = true;
  }